

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O3

void copymaps(char *filepath)

{
  FILE *__stream;
  FILE *__s;
  size_t __size;
  char mapfile [16];
  char newmapfile [256];
  char buffer [256];
  char local_238 [272];
  undefined1 local_128 [264];
  
  builtin_strncpy(local_238,"/proc/self/maps",0x10);
  snprintf(local_238 + 0x10,0x100,"%s.maps",filepath);
  __stream = fopen(local_238,"r");
  if (__stream != (FILE *)0x0) {
    __s = fopen(local_238 + 0x10,"w");
    if (__s != (FILE *)0x0) {
      __size = fread(local_128,1,0x100,__stream);
      if (__size != 0) {
        do {
          fwrite(local_128,__size,1,__s);
          __size = fread(local_128,1,0x100,__stream);
        } while (__size != 0);
      }
      fclose(__s);
    }
    fclose(__stream);
  }
  printf("Copy %s to %s\n",local_238,local_238 + 0x10);
  puts("Please use below command and try to find the memory leak line in your source file");
  printf("smtaddr2line.sh %s %s %s\n",filepath,local_238 + 0x10,
         "/ #one specific directory that contains current current process\'s excutable binary and linked shared libraies"
        );
  return;
}

Assistant:

void copymaps(char* filepath)
{
    char mapfile[] = "/proc/self/maps";
    char newmapfile[PATH_MAX];
    snprintf(newmapfile, sizeof(newmapfile), "%s.maps", filepath);
    FILE* rf = fopen(mapfile, "r");
    if (rf) {
        FILE* wf = fopen(newmapfile, "w");
        if (wf) {
            char buffer[256];
            size_t rsz;
            while (rsz = fread(buffer, 1, sizeof(buffer), rf))
                fwrite(buffer, rsz, 1, wf);
            fclose(wf);
        }
        fclose(rf);
    }
    SMTLOG("Copy %s to %s\n", mapfile, newmapfile);
    SMTLOG("Please use below command and try to find the memory leak line in your source file\n");
    SMTLOG("smtaddr2line.sh %s %s %s\n", filepath, newmapfile, "/ #one specific directory that contains current current process's excutable binary and linked shared libraies");
}